

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

void Sfm_ObjSetdownSimInfo(Abc_Obj_t *pObj)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  word uSims [2];
  uint local_28 [2];
  long local_20;
  
  plVar2 = (long *)pObj->pNtk->pData;
  if ((*(int *)(*plVar2 + 0x58) != 0) && (lVar4 = plVar2[0x13], 0 < (long)(int)lVar4)) {
    uVar7 = 0;
    uVar6 = (ulong)*(uint *)((long)plVar2 + 0x104);
    if ((int)*(uint *)((long)plVar2 + 0x104) < 1) {
      uVar6 = uVar7;
    }
    do {
      if (uVar7 == uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = *(int *)(plVar2[0x21] + uVar7 * 4);
      lVar8 = (long)iVar1;
      if ((lVar8 < 0) || (*(int *)((long)plVar2 + 0x144) <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      lVar3 = plVar2[0x29];
      uVar9 = *(ulong *)(lVar3 + lVar8 * 8);
      lVar10 = 0;
      do {
        uVar5 = *(uint *)((long)plVar2 + lVar10 * 2 + 0x1d8);
        if (0x1f < (int)uVar5) {
          uVar5 = 0x20;
        }
        if (0x40 < uVar5) {
          __assert_fail("nBits >= 0 && nBits <= 64",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0xc2,"word Abc_Tt6Mask(int)");
        }
        if ((long)*(int *)((long)plVar2 + lVar10 * 8 + 0x1bc) <= (long)(uVar7 * 8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        *(ulong *)(local_28 + lVar10) =
             ((*(ulong *)(plVar2[lVar10 + 0x38] + uVar7 * 0x40) ^ uVar9) << (-(char)uVar5 & 0x3fU))
             >> (-(char)uVar5 & 0x3fU) ^ uVar9;
        uVar9 = uVar9 >> 0x20;
        lVar10 = lVar10 + 2;
      } while (lVar10 == 2);
      *(ulong *)(lVar3 + lVar8 * 8) = local_20 << 0x20 | (ulong)local_28[0];
      uVar7 = uVar7 + 1;
    } while (uVar7 != (long)(int)lVar4);
  }
  return;
}

Assistant:

static inline void Sfm_ObjSetdownSimInfo( Abc_Obj_t * pObj )
{
    int nPatKeep = 32;
    Sfm_Dec_t * p = Sfm_DecMan( pObj );
    int c, d; word uSim, uSims[2], uMask;
    if ( !p->pPars->fUseSim )
        return;
    for ( d = 0; d < p->nDivs; d++ )
    {
        uSim = Vec_WrdEntry( &p->vObjSims, Vec_IntEntry(&p->vObjMap, d) );
        for ( c = 0; c < 2; c++ )
        {
            uMask = Abc_Tt6Mask( Abc_MinInt(p->nPats[c], nPatKeep) );
            uSims[c] = (Sfm_DecDivPats(p, d, c)[0] & uMask) | (uSim & ~uMask);
            uSim >>= 32;
        }
        uSim = (uSims[0] & 0xFFFFFFFF) | (uSims[1] << 32);
        Vec_WrdWriteEntry( &p->vObjSims, Vec_IntEntry(&p->vObjMap, d), uSim );
    }
}